

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  int iVar2;
  uint uVar3;
  stbi_uc *psVar4;
  undefined8 *puVar5;
  byte *pbVar6;
  char *pcVar7;
  byte bVar8;
  bool bVar9;
  
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_001369a2;
    stbi__refill_buffer(s);
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'G') goto LAB_001369a2;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_001369a2;
    stbi__refill_buffer(s);
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'I') goto LAB_001369a2;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_001369a2;
    stbi__refill_buffer(s);
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != 'F') goto LAB_001369a2;
  psVar4 = s->img_buffer;
  if (s->img_buffer_end <= psVar4) {
    if (s->read_from_callbacks == 0) goto LAB_001369a2;
    stbi__refill_buffer(s);
    psVar4 = s->img_buffer;
  }
  s->img_buffer = psVar4 + 1;
  if (*psVar4 != '8') goto LAB_001369a2;
  psVar4 = s->img_buffer;
  if (psVar4 < s->img_buffer_end) {
LAB_0013683b:
    s->img_buffer = psVar4 + 1;
    sVar1 = *psVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar4 = s->img_buffer;
      goto LAB_0013683b;
    }
    sVar1 = '\0';
  }
  if ((sVar1 != '7') && (sVar1 != '9')) {
LAB_001369a2:
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
    *puVar5 = "not GIF";
    return 0;
  }
  psVar4 = s->img_buffer;
  if (psVar4 < s->img_buffer_end) {
LAB_00136882:
    s->img_buffer = psVar4 + 1;
    bVar9 = *psVar4 == 'a';
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar4 = s->img_buffer;
      goto LAB_00136882;
    }
    bVar9 = false;
  }
  puVar5 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
  if (!bVar9) {
    pcVar7 = "not GIF";
    goto LAB_001369d8;
  }
  *puVar5 = "";
  iVar2 = stbi__get16le(s);
  g->w = iVar2;
  iVar2 = stbi__get16le(s);
  g->h = iVar2;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_001368fa:
    s->img_buffer = pbVar6 + 1;
    uVar3 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar6 = s->img_buffer;
      goto LAB_001368fa;
    }
    uVar3 = 0;
  }
  g->flags = uVar3;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_00136935:
    s->img_buffer = pbVar6 + 1;
    uVar3 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar6 = s->img_buffer;
      goto LAB_00136935;
    }
    uVar3 = 0;
  }
  g->bgindex = uVar3;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_00136970:
    s->img_buffer = pbVar6 + 1;
    uVar3 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar6 = s->img_buffer;
      goto LAB_00136970;
    }
    uVar3 = 0;
  }
  g->ratio = uVar3;
  g->transparent = -1;
  if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
    if (comp != (int *)0x0) {
      *comp = 4;
    }
    if (is_info == 0) {
      bVar8 = (byte)g->flags;
      if ((char)bVar8 < '\0') {
        stbi__gif_parse_colortable(s,g->pal,2 << (bVar8 & 7),-1);
        return 1;
      }
      return 1;
    }
    return 1;
  }
  pcVar7 = "too large";
LAB_001369d8:
  *puVar5 = pcVar7;
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}